

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::Coap::SendResponse
          (Error *__return_storage_ptr__,Coap *this,Request *aRequest,Response *aResponse)

{
  Message *pMVar1;
  uint16_t uVar2;
  Endpoint *aEndpoint;
  ByteArray local_40;
  Message *local_28;
  Response *aResponse_local;
  Request *aRequest_local;
  Coap *this_local;
  
  local_28 = aResponse;
  aResponse_local = aRequest;
  aRequest_local = (Request *)this;
  this_local = (Coap *)__return_storage_ptr__;
  uVar2 = Message::GetMessageId(aResponse);
  pMVar1 = local_28;
  if (uVar2 == 0) {
    uVar2 = Message::GetMessageId(aResponse_local);
    Message::SetMessageId(pMVar1,uVar2);
  }
  pMVar1 = local_28;
  Message::GetToken(&local_40,aResponse_local);
  Message::SetToken(pMVar1,&local_40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_40);
  pMVar1 = local_28;
  aEndpoint = Message::GetEndpoint(aResponse_local);
  Message::SetEndpoint(pMVar1,aEndpoint);
  ResponsesCache::Put(&this->mResponsesCache,local_28);
  Send(__return_storage_ptr__,this,local_28);
  return __return_storage_ptr__;
}

Assistant:

Error Coap::SendResponse(const Request &aRequest, Response &aResponse)
{
    // Set message id to request's id
    if (aResponse.GetMessageId() == 0)
    {
        aResponse.SetMessageId(aRequest.GetMessageId());
    }

    // Set the token to request's token
    aResponse.SetToken(aRequest.GetToken());

    // Set message info
    aResponse.SetEndpoint(aRequest.GetEndpoint());

    // Enqueue response
    mResponsesCache.Put(aResponse);

    return Send(aResponse);
}